

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool art_internal_validate(art_t *art,char **reason,art_validate_cb_t validate_cb,void *context)

{
  art_internal_validate_t validator;
  _Bool _Var1;
  char **ppcVar2;
  long lVar3;
  char *reason_local;
  uint6 uStack_e;
  char *local_8;
  
  ppcVar2 = &local_8;
  if (reason != (char **)0x0) {
    ppcVar2 = reason;
  }
  *ppcVar2 = (char *)0x0;
  if (art->root == 0) {
    _Var1 = true;
  }
  else {
    lVar3 = 2;
    do {
      if ((art->first_free[lVar3 + 5] != 0) &&
         (art->first_free[lVar3 + 5] < art->first_free[lVar3 + -1])) {
        *ppcVar2 = "first_free > capacity";
        return false;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 7);
    lVar3 = (ulong)uStack_e << 0x10;
    validator.validate_cb = validate_cb;
    validator.reason = ppcVar2;
    validator.context = context;
    validator.depth = 0;
    validator.current_key[0] = '\0';
    validator.current_key[1] = '\0';
    validator.current_key[2] = '\0';
    validator.current_key[3] = '\0';
    validator.current_key[4] = (char)lVar3;
    validator.current_key[5] = (char)((ulong)lVar3 >> 8);
    validator._34_6_ = (int6)((ulong)lVar3 >> 0x10);
    _Var1 = art_internal_validate_at(art,art->root,validator);
  }
  return _Var1;
}

Assistant:

bool art_internal_validate(const art_t *art, const char **reason,
                           art_validate_cb_t validate_cb, void *context) {
    const char *reason_local;
    if (reason == NULL) {
        // Always allow assigning through *reason
        reason = &reason_local;
    }
    *reason = NULL;
    if (art->root == CROARING_ART_NULL_REF) {
        return true;
    }
    art_internal_validate_t validator = {
        .reason = reason,
        .validate_cb = validate_cb,
        .context = context,
        .depth = 0,
        .current_key = CROARING_ZERO_INITIALIZER,
    };
    for (art_typecode_t type = CROARING_ART_LEAF_TYPE;
         type <= CROARING_ART_NODE256_TYPE; ++type) {
        uint64_t capacity = art->capacities[type];
        for (uint64_t i = 0; i < capacity; ++i) {
            uint64_t first_free = art->first_free[type];
            if (first_free > capacity) {
                return art_validate_fail(&validator, "first_free > capacity");
            }
        }
    }
    return art_internal_validate_at(art, art->root, validator);
}